

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
             *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  size_t sVar1;
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_RSI;
  long in_RDI;
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  bin_writer<3> *in_stack_ffffffffffffffc0;
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_stack_ffffffffffffffc8;
  ostream_type *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  ostream_type *in_stack_ffffffffffffffe0;
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_stack_ffffffffffffffe8;
  
  sVar1 = basic_string_view<char>::size((basic_string_view<char> *)(in_RDI + 8));
  if (sVar1 != 0) {
    basic_string_view<char>::begin((basic_string_view<char> *)(in_RDI + 8));
    basic_string_view<char>::end((basic_string_view<char> *)(in_RDI + 8));
    std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator
              ((ostream_iterator<char,_char,_std::char_traits<char>_> *)&stack0xffffffffffffffd0,
               in_RSI);
    internal::copy_str<char,char_const*,std::ostream_iterator<char,char,std::char_traits<char>>>
              (in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8
              );
    in_RSI->_M_stream = in_stack_ffffffffffffffe0;
    in_RSI->_M_string = (char *)in_stack_ffffffffffffffe8;
  }
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator
            ((ostream_iterator<char,_char,_std::char_traits<char>_> *)&stack0xffffffffffffffb0,
             in_RSI);
  std::fill_n<std::ostream_iterator<char,char,std::char_traits<char>>,unsigned_long,char>
            (in_stack_ffffffffffffffe8,(unsigned_long)in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8);
  in_RSI->_M_stream = (ostream_type *)in_stack_ffffffffffffffc0;
  in_RSI->_M_string = (char *)in_stack_ffffffffffffffc8;
  int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>::operator()
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }